

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O2

void TakeScreenshot(char *fileName)

{
  Image image;
  int logType;
  anon_struct_8_1_814e3414_for_Storage aVar1;
  _Bool _Var2;
  char *pcVar3;
  uchar *__ptr;
  Vector2 VVar4;
  undefined1 auVar5 [16];
  char path [512];
  
  pcVar3 = strchr(fileName,0x27);
  if (pcVar3 != (char *)0x0) {
    TraceLog(4,"SYSTEM: Provided fileName could be potentially malicious, avoid [\'] character");
    return;
  }
  VVar4 = GetWindowScaleDPI();
  __ptr = rlReadScreenPixels((int)((float)CORE.Window.render.width * VVar4.x),
                             (int)(VVar4.y * (float)CORE.Window.render.height));
  auVar5._4_4_ = 0;
  auVar5._0_4_ = CORE.Window.render.width;
  auVar5._8_4_ = CORE.Window.render.height;
  auVar5._12_4_ = 0;
  image.height = (int)((float)(SUB168(auVar5 | _DAT_00174280,8) - DAT_00174280._8_8_) * VVar4.y);
  image.width = (int)((float)(SUB168(auVar5 | _DAT_00174280,0) - (double)DAT_00174280) * VVar4.x);
  memset(path,0,0x200);
  aVar1 = CORE.Storage;
  pcVar3 = GetFileName(fileName);
  pcVar3 = TextFormat("%s/%s",aVar1.basePath,pcVar3);
  strcpy(path,pcVar3);
  image.data = __ptr;
  image.mipmaps = 1;
  image.format = 7;
  ExportImage(image,path);
  free(__ptr);
  _Var2 = FileExists(path);
  if (_Var2) {
    pcVar3 = "SYSTEM: [%s] Screenshot taken successfully";
    logType = 3;
  }
  else {
    pcVar3 = "SYSTEM: [%s] Screenshot could not be saved";
    logType = 4;
  }
  TraceLog(logType,pcVar3,path);
  return;
}

Assistant:

void TakeScreenshot(const char *fileName)
{
#if defined(SUPPORT_MODULE_RTEXTURES)
    // Security check to (partially) avoid malicious code
    if (strchr(fileName, '\'') != NULL) { TRACELOG(LOG_WARNING, "SYSTEM: Provided fileName could be potentially malicious, avoid [\'] character"); return; }

    Vector2 scale = GetWindowScaleDPI();
    unsigned char *imgData = rlReadScreenPixels((int)((float)CORE.Window.render.width*scale.x), (int)((float)CORE.Window.render.height*scale.y));
    Image image = { imgData, (int)((float)CORE.Window.render.width*scale.x), (int)((float)CORE.Window.render.height*scale.y), 1, PIXELFORMAT_UNCOMPRESSED_R8G8B8A8 };

    char path[512] = { 0 };
    strcpy(path, TextFormat("%s/%s", CORE.Storage.basePath, GetFileName(fileName)));

    ExportImage(image, path);           // WARNING: Module required: rtextures
    RL_FREE(imgData);

    if (FileExists(path)) TRACELOG(LOG_INFO, "SYSTEM: [%s] Screenshot taken successfully", path);
    else TRACELOG(LOG_WARNING, "SYSTEM: [%s] Screenshot could not be saved", path);
#else
    TRACELOG(LOG_WARNING,"IMAGE: ExportImage() requires module: rtextures");
#endif
}